

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O2

void __thiscall
CS248::DynamicScene::Skeleton::drawJoint(Skeleton *this,Joint *joint,int *pickID,bool pickMode)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  pointer ppJVar14;
  undefined8 uVar15;
  DrawStyle *this_00;
  undefined7 in_register_00000009;
  pointer ppJVar16;
  undefined4 uVar17;
  GLfloat white [4];
  
  dVar1 = (joint->super_SceneObject).position.x;
  dVar2 = (joint->super_SceneObject).position.y;
  dVar3 = (joint->super_SceneObject).rotation.x;
  dVar4 = (joint->super_SceneObject).position.z;
  dVar5 = (joint->super_SceneObject).rotation.y;
  dVar6 = (joint->axis).x;
  dVar7 = (joint->super_SceneObject).rotation.z;
  dVar8 = (joint->axis).y;
  dVar9 = (joint->super_SceneObject).scale.x;
  dVar10 = (joint->axis).z;
  dVar11 = (joint->super_SceneObject).scale.y;
  dVar12 = joint->renderScale;
  dVar13 = (joint->super_SceneObject).scale.z;
  uVar15 = gluNewQuadric();
  glPushMatrix();
  glTranslated(SUB84(dVar1,0),dVar2,dVar4);
  glRotatef((float)dVar3,0x3f800000,0,0);
  glRotatef((float)dVar5,0,0x3f800000,0);
  glRotatef((float)dVar7,0,0,0x3f800000);
  glScalef((float)dVar9,(float)dVar11,(float)dVar13);
  this_00 = get_draw_style(this,joint);
  if ((int)CONCAT71(in_register_00000009,pickMode) == 0) {
    if (this_00 == this->defaultStyle) {
      white[0] = 1.0;
      white[1] = 1.0;
      white[2] = 1.0;
      white[3] = 1.0;
      glEnable(0xb50);
      glEnable(0x4000);
      glLightfv(0x4000,0x1201,white);
      glMaterialfv(0x408,0x1201,white);
      glEnable(0xbe2);
      glBlendFunc(1,1);
    }
    else {
      glDisable(0xb50);
      DrawStyle::style_joint(this_00);
    }
  }
  else {
    newPickElement(this,pickID,joint);
  }
  glBegin(1);
  glVertex3d(0,0,0);
  uVar17 = SUB84(dVar6,0);
  glVertex3d(uVar17,dVar8,dVar10);
  glEnd();
  glTranslated(uVar17,dVar8,dVar10);
  gluSphere(SUB84(dVar12 * 0.03,0),uVar15,0x19);
  if ((pickMode) || (this_00 == this->defaultStyle)) {
    glDisable(0xbe2);
  }
  else {
    glEnable(0xb50);
    DrawStyle::style_reset(this_00);
  }
  ppJVar14 = (joint->kids).
             super__Vector_base<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (ppJVar16 = (joint->kids).
                  super__Vector_base<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppJVar16 != ppJVar14;
      ppJVar16 = ppJVar16 + 1) {
    drawJoint(this,*ppJVar16,pickID,pickMode);
  }
  glPopMatrix();
  gluDeleteQuadric(uVar15);
  return;
}

Assistant:

void Skeleton::drawJoint(Joint* joint, int& pickID, bool pickMode) {
  Vector3D jointPos = joint->position;
  Vector3D jointRot = joint->rotation;
  Vector3D jointScale = joint->scale;
  Vector3D jointAxis = joint->axis;
  double jointRenderScale = joint->renderScale;
  GLUquadric* q = gluNewQuadric();

  glPushMatrix();

  glTranslated(jointPos.x, jointPos.y, jointPos.z);
  glRotatef(jointRot.x, 1.0f, 0.0f, 0.0f);
  glRotatef(jointRot.y, 0.0f, 1.0f, 0.0f);
  glRotatef(jointRot.z, 0.0f, 0.0f, 1.0f);
  glScalef(jointScale.x, jointScale.y, jointScale.z);

  DrawStyle* style = get_draw_style(joint);
  if (pickMode) {
    newPickElement(pickID, joint);
  } else if (style != defaultStyle) {
    glDisable(GL_LIGHTING);
    style->style_joint();
  } else {
    GLfloat white[4] = {1., 1., 1., 1.};

    glEnable(GL_LIGHTING);
    glEnable(GL_LIGHT0);
    glLightfv(GL_LIGHT0, GL_DIFFUSE, white);
    glMaterialfv(GL_FRONT_AND_BACK, GL_DIFFUSE, white);

    glEnable(GL_BLEND);
    // glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
    glBlendFunc(GL_ONE, GL_ONE);
  }

  glBegin(GL_LINES);
  glVertex3d(0, 0, 0);
  glVertex3d(jointAxis.x, jointAxis.y, jointAxis.z);
  glEnd();
  glTranslated(jointAxis.x, jointAxis.y, jointAxis.z);
  gluSphere(q, jointRenderScale * 0.03, 25, 25);

  if (!pickMode && style != defaultStyle) {
    glEnable(GL_LIGHTING);
    style->style_reset();
  } else {
    glDisable(GL_BLEND);
  }

  for (Joint* child : joint->kids) drawJoint(child, pickID, pickMode);

  glPopMatrix();
  gluDeleteQuadric(q);
}